

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JUnitOutputTest.cpp
# Opt level: O0

Utest * __thiscall
TEST_JUnitOutputTest_twoTestGroupsWriteToTwoDifferentFiles_TestShell::createTest
          (TEST_JUnitOutputTest_twoTestGroupsWriteToTwoDifferentFiles_TestShell *this)

{
  TEST_JUnitOutputTest_twoTestGroupsWriteToTwoDifferentFiles_Test *this_00;
  TEST_JUnitOutputTest_twoTestGroupsWriteToTwoDifferentFiles_TestShell *this_local;
  
  this_00 = (TEST_JUnitOutputTest_twoTestGroupsWriteToTwoDifferentFiles_Test *)
            operator_new(0x28,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/JUnitOutputTest.cpp"
                         ,0x26d);
  TEST_JUnitOutputTest_twoTestGroupsWriteToTwoDifferentFiles_Test::
  TEST_JUnitOutputTest_twoTestGroupsWriteToTwoDifferentFiles_Test(this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(JUnitOutputTest, twoTestGroupsWriteToTwoDifferentFiles)
{
    testCaseRunner->start()
            .withGroup("firstTestGroup")
                .withTest("testName")
            .withGroup("secondTestGroup")
                .withTest("testName")
            .end();

    CHECK(fileSystem.file("cpputest_firstTestGroup.xml") != NULLPTR);
    CHECK(fileSystem.file("cpputest_secondTestGroup.xml") != NULLPTR);

}